

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

fdb_status
fdb_iterator_init(fdb_kvs_handle *handle,fdb_iterator **ptr_iterator,void *start_key,
                 size_t start_keylen,void *end_key,size_t end_keylen,fdb_iterator_opt_t opt)

{
  long lVar1;
  fdb_status fVar2;
  hbtrie_result hVar3;
  fdb_iterator *pfVar4;
  char *pcVar5;
  void *pvVar6;
  undefined8 *__src;
  hbtrie_iterator *phVar7;
  wal_item *pwVar8;
  fdb_seqnum_t in_stack_00000170;
  fdb_kvs_handle **in_stack_00000178;
  fdb_kvs_handle *in_stack_00000180;
  undefined8 uStack_140;
  undefined1 auStack_138 [8];
  err_log_callback *local_130;
  undefined8 uStack_128;
  size_t local_120;
  wal_item_header query_key;
  wal_item query;
  uint8_t *end_key_temp;
  uint8_t *start_key_temp;
  size_t size_chunk;
  fdb_iterator *iterator;
  fdb_status fs;
  hbtrie_result hr;
  size_t end_keylen_local;
  void *end_key_local;
  size_t start_keylen_local;
  void *start_key_local;
  fdb_iterator **ptr_iterator_local;
  fdb_kvs_handle *handle_local;
  
  __src = (undefined8 *)auStack_138;
  if (handle == (fdb_kvs_handle *)0x0) {
    handle_local._4_4_ = FDB_RESULT_INVALID_HANDLE;
  }
  else if ((start_keylen < 0xff81) &&
          ((((handle->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0 ||
            ((start_keylen <= (handle->config).blocksize - 0x100 &&
             (end_keylen <= (handle->config).blocksize - 0x100)))) && (end_keylen < 0xff81)))) {
    if ((((opt & 4) == 0) || ((start_key != (void *)0x0 && (start_keylen != 0)))) &&
       (((opt & 8) == 0 || ((end_key != (void *)0x0 && (end_keylen != 0)))))) {
      if (handle->shandle == (snap_handle *)0x0) {
        uStack_140 = 0x158930;
        fdb_check_file_reopen(handle,(file_status_t *)0x0);
        uStack_140 = 0x158939;
        fdb_sync_db_header((fdb_kvs_handle *)query.seqnum);
      }
      uStack_140 = 0x158948;
      pfVar4 = (fdb_iterator *)calloc(1,0x98);
      if (handle->shandle == (snap_handle *)0x0) {
        uStack_140 = 0x158972;
        fVar2 = fdb_snapshot_open(in_stack_00000180,in_stack_00000178,in_stack_00000170);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          local_130 = &handle->log_callback;
          uStack_140 = 0x1589aa;
          uStack_128._4_4_ = fVar2;
          pcVar5 = _fdb_kvs_get_name((fdb_kvs_handle *)start_key_temp,(filemgr *)end_key_temp);
          fdb_log_impl(local_130,2,(fdb_status)(ulong)(uint)uStack_128._4_4_,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/iterator.cc"
                       ,"fdb_iterator_init",0x97,
                       "Failed to create an iterator instance due to the failure of open operation on the KV Store \'%s\' in a database file \'%s\'"
                       ,pcVar5,handle->file->filename);
          return fVar2;
        }
        pfVar4->snapshot_handle = false;
      }
      else {
        pfVar4->handle = handle;
        pfVar4->snapshot_handle = true;
      }
      pfVar4->opt = opt;
      uStack_140 = 0x158a40;
      pvVar6 = malloc(0xfff0);
      pfVar4->_key = pvVar6;
      uStack_140 = 0x158a67;
      memset(pfVar4->_key,0,(ulong)(pfVar4->handle->config).chunksize);
      pfVar4->_keylen = 0;
      pfVar4->_offset = 0xffffffffffffffff;
      pfVar4->hbtrie_iterator = (hbtrie_iterator *)0x0;
      pfVar4->seqtree_iterator = (btree_iterator *)0x0;
      pfVar4->seqtrie_iterator = (hbtrie_iterator *)0x0;
      if (pfVar4->handle->kvs == (kvs_info *)0x0) {
        if (start_key == (void *)0x0) {
          pfVar4->start_key = (void *)0x0;
          (pfVar4->field_10).start_seqnum = 0;
        }
        else {
          uStack_140 = 0x158cc3;
          pvVar6 = malloc(start_keylen);
          pfVar4->start_key = pvVar6;
          uStack_140 = 0x158ce3;
          memcpy(pfVar4->start_key,start_key,start_keylen);
          (pfVar4->field_10).start_keylen = start_keylen;
        }
        if (end_key == (void *)0x0) {
          pfVar4->end_key = (void *)0x0;
          _fs = (void *)0x0;
        }
        else {
          uStack_140 = 0x158d15;
          pvVar6 = malloc(end_keylen);
          pfVar4->end_key = pvVar6;
          uStack_140 = 0x158d35;
          memcpy(pfVar4->end_key,end_key,end_keylen);
          _fs = (void *)end_keylen;
        }
        (pfVar4->field_12).end_seqnum = (fdb_seqnum_t)_fs;
        start_keylen_local = (size_t)start_key;
      }
      else {
        _fs = (void *)(ulong)(handle->config).chunksize;
        if (start_key == (void *)0x0) {
          lVar1 = -((long)_fs + 0xfU & 0xfffffffffffffff0);
          start_keylen_local = (size_t)(auStack_138 + lVar1);
          *(undefined8 *)(auStack_138 + lVar1 + -8) = 0x158b00;
          kvid2buf(*(size_t *)((long)&local_120 + lVar1),
                   *(fdb_kvs_id_t *)((long)&uStack_128 + lVar1),*(void **)((long)&local_130 + lVar1)
                  );
          end_key_local = _fs;
        }
        else {
          lVar1 = -((long)_fs + start_keylen + 0xf & 0xfffffffffffffff0);
          start_keylen_local = (size_t)(auStack_138 + lVar1);
          *(undefined8 *)(auStack_138 + lVar1 + -8) = 0x158b4c;
          kvid2buf(*(size_t *)((long)&local_120 + lVar1),
                   *(fdb_kvs_id_t *)((long)&uStack_128 + lVar1),*(void **)((long)&local_130 + lVar1)
                  );
          *(undefined8 *)(auStack_138 + lVar1 + -8) = 0x158b61;
          memcpy((undefined1 *)(start_keylen_local + (long)_fs),start_key,start_keylen);
          end_key_local = (void *)((long)_fs + start_keylen);
        }
        if (end_key == (void *)0x0) {
          __src = (undefined8 *)(start_keylen_local + -((long)_fs + 0xfU & 0xfffffffffffffff0));
          *(undefined8 *)((long)__src + -8) = 0x158bb5;
          kvid2buf(*(size_t *)((long)__src + 0x18),*(fdb_kvs_id_t *)((long)__src + 0x10),
                   *(void **)((long)__src + 8));
        }
        else {
          __src = (undefined8 *)
                  (start_keylen_local + -((long)_fs + end_keylen + 0xf & 0xfffffffffffffff0));
          *(undefined8 *)((long)__src + -8) = 0x158c01;
          kvid2buf(*(size_t *)((long)__src + 0x18),*(fdb_kvs_id_t *)((long)__src + 0x10),
                   *(void **)((long)__src + 8));
          *(undefined8 *)((long)__src + -8) = 0x158c16;
          memcpy((undefined1 *)((long)__src + (long)_fs),end_key,end_keylen);
          _fs = (void *)((long)_fs + end_keylen);
        }
        *(undefined8 *)((long)__src + -8) = 0x158c33;
        pvVar6 = malloc((size_t)end_key_local);
        pfVar4->start_key = pvVar6;
        pvVar6 = pfVar4->start_key;
        *(undefined8 *)((long)__src + -8) = 0x158c53;
        memcpy(pvVar6,(void *)start_keylen_local,(size_t)end_key_local);
        pfVar4->field_10 = (anon_union_8_2_717a2572_for__fdb_iterator_10)end_key_local;
        *(undefined8 *)((long)__src + -8) = 0x158c68;
        pvVar6 = malloc((size_t)_fs);
        pfVar4->end_key = pvVar6;
        pvVar6 = pfVar4->end_key;
        *(undefined8 *)((long)__src + -8) = 0x158c88;
        memcpy(pvVar6,__src,(size_t)_fs);
        (pfVar4->field_12).end_seqnum = (fdb_seqnum_t)_fs;
      }
      __src[-1] = 0x158d4b;
      phVar7 = (hbtrie_iterator *)malloc(0x98);
      pfVar4->hbtrie_iterator = phVar7;
      __src[-1] = 0x158d76;
      hVar3 = hbtrie_iterator_init
                        ((hbtrie *)__src[2],(hbtrie_iterator *)__src[1],(void *)*__src,__src[-1]);
      if (hVar3 != HBTRIE_RESULT_SUCCESS) {
        __src[-1] = 0x158da0;
        __assert_fail("hr == HBTRIE_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/iterator.cc"
                      ,0xf0,
                      "fdb_status fdb_iterator_init(fdb_kvs_handle *, fdb_iterator **, const void *, size_t, const void *, size_t, fdb_iterator_opt_t)"
                     );
      }
      __src[-1] = 0x158dcb;
      wal_itr_init((filemgr *)__src[4],(snap_handle *)__src[3],*(bool *)((long)__src + 0x17),
                   (wal_iterator **)__src[1]);
      if (start_keylen_local == 0) {
        __src[-1] = 0x158e2c;
        pwVar8 = wal_itr_first((wal_iterator *)__src[2]);
        pfVar4->tree_cursor = pwVar8;
      }
      else {
        query_key.avl_key.right = (avl_node *)pfVar4->start_key;
        query_key.key._0_2_ = (short)(pfVar4->field_10).start_seqnum;
        __src[-1] = 0x158e12;
        pwVar8 = wal_itr_search_greater((wal_iterator *)__src[4],(wal_item *)__src[3]);
        pfVar4->tree_cursor = pwVar8;
      }
      if (pfVar4->tree_cursor != (wal_item *)0x0) {
        pfVar4->tree_cursor_start = pfVar4->tree_cursor;
      }
      pfVar4->tree_cursor_prev = pfVar4->tree_cursor;
      pfVar4->direction = '\0';
      pfVar4->status = '\0';
      pfVar4->_dhandle = (docio_handle *)0x0;
      *ptr_iterator = pfVar4;
      pfVar4->handle->num_iterators = pfVar4->handle->num_iterators + 1;
      __src[-1] = 0x158eab;
      fVar2 = fdb_iterator_next((fdb_iterator *)*__src);
      if (fVar2 == FDB_RESULT_FILE_CORRUPTION) {
        __src[-1] = 0x158ebd;
        fdb_iterator_close((fdb_iterator *)__src[2]);
        handle_local._4_4_ = FDB_RESULT_FILE_CORRUPTION;
      }
      else {
        handle_local._4_4_ = FDB_RESULT_SUCCESS;
      }
    }
    else {
      handle_local._4_4_ = FDB_RESULT_INVALID_ARGS;
    }
  }
  else {
    handle_local._4_4_ = FDB_RESULT_INVALID_ARGS;
  }
  return handle_local._4_4_;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_init(fdb_kvs_handle *handle,
                             fdb_iterator **ptr_iterator,
                             const void *start_key,
                             size_t start_keylen,
                             const void *end_key,
                             size_t end_keylen,
                             fdb_iterator_opt_t opt)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (start_keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
           (start_keylen > handle->config.blocksize - HBTRIE_HEADROOM ||
            end_keylen > handle->config.blocksize - HBTRIE_HEADROOM)) ||
        end_keylen > FDB_MAX_KEYLEN) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if ((opt & FDB_ITR_SKIP_MIN_KEY && (!start_key || !start_keylen)) ||
        (opt & FDB_ITR_SKIP_MAX_KEY && (!end_key || !end_keylen))) {
        return FDB_RESULT_INVALID_ARGS;
    }

    hbtrie_result hr;
    fdb_status fs;
    LATENCY_STAT_START();

    if (!handle->shandle) {
        // If compaction is already done before this line,
        // handle->file needs to be replaced with handle->new_file.
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);
    }

    fdb_iterator *iterator = (fdb_iterator *)calloc(1, sizeof(fdb_iterator));

    if (!handle->shandle) {
        // snapshot handle doesn't exist
        // open a new handle to make the iterator handle as a snapshot
        fs = fdb_snapshot_open(handle, &iterator->handle, FDB_SNAPSHOT_INMEM);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(&handle->log_callback, FDB_LOG_ERROR, fs,
                    "Failed to create an iterator instance due to the failure of "
                    "open operation on the KV Store '%s' in a database file '%s'",
                    _fdb_kvs_get_name(handle, handle->file),
                    handle->file->filename);
            return fs;
        }
        iterator->snapshot_handle = false;
    } else {
        // Snapshot handle exists
        // We don't need to open a new handle.. just point to the snapshot handle.
        iterator->handle = handle;
        iterator->snapshot_handle = true;
    }
    iterator->opt = opt;

    iterator->_key = (void*)malloc(FDB_MAX_KEYLEN_INTERNAL);
    // set to zero the first <chunksize> bytes
    memset(iterator->_key, 0x0, iterator->handle->config.chunksize);
    iterator->_keylen = 0;
    iterator->_offset = BLK_NOT_FOUND;
    iterator->hbtrie_iterator = NULL;
    iterator->seqtree_iterator = NULL;
    iterator->seqtrie_iterator = NULL;

    if (iterator->handle->kvs) {
        // multi KV instance mode .. prepend KV ID
        size_t size_chunk = handle->config.chunksize;
        uint8_t *start_key_temp, *end_key_temp;

        if (start_key == NULL) {
            start_key_temp = alca(uint8_t, size_chunk);
            kvid2buf(size_chunk, iterator->handle->kvs->id, start_key_temp);
            start_key = start_key_temp;
            start_keylen = size_chunk;
        } else {
            start_key_temp = alca(uint8_t, size_chunk + start_keylen);
            kvid2buf(size_chunk, iterator->handle->kvs->id, start_key_temp);
            memcpy(start_key_temp + size_chunk, start_key, start_keylen);
            start_key = start_key_temp;
            start_keylen += size_chunk;
        }

        if (end_key == NULL) {
            // set end_key as NULL key of the next KV ID.
            // NULL key doesn't actually exist so that the iterator ends
            // at the last key of the current KV ID.
            end_key_temp = alca(uint8_t, size_chunk);
            kvid2buf(size_chunk, iterator->handle->kvs->id+1, end_key_temp);
            end_key = end_key_temp;
            end_keylen = size_chunk;
        } else {
            end_key_temp = alca(uint8_t, size_chunk + end_keylen);
            kvid2buf(size_chunk, iterator->handle->kvs->id, end_key_temp);
            memcpy(end_key_temp + size_chunk, end_key, end_keylen);
            end_key = end_key_temp;
            end_keylen += size_chunk;
        }

        iterator->start_key = (void*)malloc(start_keylen);
        memcpy(iterator->start_key, start_key, start_keylen);
        iterator->start_keylen = start_keylen;

        iterator->end_key = (void*)malloc(end_keylen);
        memcpy(iterator->end_key, end_key, end_keylen);
        iterator->end_keylen = end_keylen;

    } else { // single KV instance mode
        if (start_key == NULL) {
            iterator->start_key = NULL;
            iterator->start_keylen = 0;
        } else {
            iterator->start_key = (void*)malloc(start_keylen);
            memcpy(iterator->start_key, start_key, start_keylen);
            iterator->start_keylen = start_keylen;
        }

        if (end_key == NULL) {
            iterator->end_key = NULL;
            end_keylen = 0;
        }else{
            iterator->end_key = (void*)malloc(end_keylen);
            memcpy(iterator->end_key, end_key, end_keylen);
        }
        iterator->end_keylen = end_keylen;
    }

    // create an iterator handle for hb-trie
    iterator->hbtrie_iterator = (struct hbtrie_iterator *)
                                malloc(sizeof(struct hbtrie_iterator));
    hr = hbtrie_iterator_init(iterator->handle->trie,
                              iterator->hbtrie_iterator,
                              (void *)start_key, start_keylen);
    assert(hr == HBTRIE_RESULT_SUCCESS);

    wal_itr_init(iterator->handle->file, iterator->handle->shandle, true,
                 &iterator->wal_itr);

    if (start_key) {
        struct wal_item query;
        struct wal_item_header query_key;
        query.header = &query_key;
        query_key.key = iterator->start_key;
        query_key.keylen = iterator->start_keylen;
        iterator->tree_cursor = wal_itr_search_greater(iterator->wal_itr,
                                                       &query);
    } else {
        iterator->tree_cursor = wal_itr_first(iterator->wal_itr);
    }
    // to know reverse iteration endpoint store the start cursor
    if (iterator->tree_cursor) {
        iterator->tree_cursor_start = iterator->tree_cursor;
    }
    iterator->tree_cursor_prev = iterator->tree_cursor;
    iterator->direction = FDB_ITR_DIR_NONE;
    iterator->status = FDB_ITR_IDX;
    iterator->_dhandle = NULL; // populated at the first iterator movement

    *ptr_iterator = iterator;

    ++iterator->handle->num_iterators; // Increment the iterator counter of the KV handle
    fs = fdb_iterator_next(iterator); // position cursor at first key
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_INIT);
    if (fs == FDB_RESULT_FILE_CORRUPTION) {
        fdb_iterator_close(iterator);
        return fs;
    }

    return FDB_RESULT_SUCCESS;
}